

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

void __thiscall
front::irGenerator::irGenerator::ir_ref(irGenerator *this,LeftVal *dest,LeftVal *src,bool begin)

{
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  undefined4 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  uint32_t uVar3;
  LabelId LVar4;
  Inst *__tmp;
  VarId *__p;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar5;
  RefInst *__p_00;
  undefined7 in_register_00000009;
  shared_ptr<mir::inst::Inst> refInst;
  string *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  anon_class_1_0_00000001 local_c9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  undefined4 local_bc;
  shared_ptr<mir::inst::Inst> local_b8;
  string local_a0;
  LeftVal local_80;
  _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_b8.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_b8.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (VarId *)operator_new(0x10);
  local_bc = (undefined4)CONCAT71(in_register_00000009,begin);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_80,
                    (_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)dest);
  uVar3 = LeftValueToLabelId(this,&local_80);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  __p->id = uVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::VarId*>(a_Stack_e0,__p)
  ;
  local_c8 = a_Stack_e0[0]._M_pi;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr
    [local_80.
     super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
     super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
            (&local_c9,&local_80);
  local_80.
  super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
  super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
  pvVar5 = std::get<1ul,int,std::__cxx11::string>(src);
  pcVar1 = (pvVar5->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + pvVar5->_M_string_length);
  LVar4 = nameToLabelId(this,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (LVar4 < 0) {
    local_e8 = (string *)operator_new(0x28);
    pvVar5 = std::get<1ul,int,std::__cxx11::string>(src);
    *(string **)local_e8 = local_e8 + 0x10;
    pcVar1 = (pvVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>(local_e8,pcVar1,pcVar1 + pvVar5->_M_string_length);
    local_e8[0x20] = (string)0x1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::variant<mir::inst::VarId,std::__cxx11::string>*>
              (a_Stack_e0,
               (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8);
  }
  else {
    local_e8 = (string *)operator_new(0x28);
    *(undefined ***)local_e8 = &PTR_display_001ee058;
    *(LabelId *)(local_e8 + 8) = LVar4;
    local_e8[0x20] = (string)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::variant<mir::inst::VarId,std::__cxx11::string>*>
              (a_Stack_e0,
               (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e8);
  }
  this_00._M_pi = a_Stack_e0[0]._M_pi;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p_00 = (RefInst *)operator_new(0x40);
  uVar3 = __p->id;
  std::__detail::__variant::
  _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_58,
                    (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_e8);
  (__p_00->super_Inst).dest.super_Displayable._vptr_Displayable =
       (_func_int **)&PTR_display_001ee058;
  (__p_00->super_Inst).dest.id = uVar3;
  (__p_00->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001f0198;
  std::__detail::__variant::
  _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__p_00->val,
                    (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::RefInst*>
            (a_Stack_e0,__p_00);
  this_02._M_pi =
       local_b8.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar2 = local_bc;
  this_01._M_pi = a_Stack_e0[0]._M_pi;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_01._M_pi;
  local_b8.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__p_00;
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
  }
  if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_e0[0]._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_58);
  insertInstruction(this,&local_b8,SUB41(uVar2,0));
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  return;
}

Assistant:

void irGenerator::ir_ref(LeftVal dest, LeftVal src, bool begin) {
  shared_ptr<VarId> destVarId;
  shared_ptr<std::variant<VarId, std::string>> val;
  LabelId id;
  shared_ptr<mir::inst::Inst> refInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  if ((id = nameToLabelId(get<1>(src))) >= 0) {
    val = shared_ptr<std::variant<VarId, std::string>>(
        new std::variant<VarId, std::string>(VarId(id)));
  } else {
    val = shared_ptr<std::variant<VarId, std::string>>(
        new std::variant<VarId, std::string>(get<1>(src)));
  }

  refInst =
      shared_ptr<mir::inst::RefInst>(new mir::inst::RefInst(*destVarId, *val));

  insertInstruction(refInst, begin);
}